

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O2

void av1_nn_predict_sse3(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  float *pfVar15;
  int *piVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  float *pfVar23;
  uint num_inputs;
  long lVar24;
  float *pfVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  float *pfVar29;
  int in;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float *local_500;
  float local_488 [2];
  float afStack_480 [2];
  float local_478 [7];
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float buf [2] [128];
  
  uVar27 = 0;
  uVar21 = 0;
  num_inputs = nn_config->num_inputs;
  local_500 = input_nodes;
  while( true ) {
    if ((long)nn_config->num_hidden_layers < (long)uVar27) break;
    uVar18 = (ulong)(uint)nn_config->num_hidden_layers;
    pfVar29 = nn_config->weights[uVar27];
    pfVar15 = buf[uVar21];
    if (uVar27 == uVar18) {
      pfVar15 = output;
    }
    pfVar4 = nn_config->bias[uVar27];
    piVar16 = nn_config->num_hidden_nodes + uVar27;
    if (uVar27 == uVar18) {
      piVar16 = &nn_config->num_outputs;
    }
    uVar3 = *piVar16;
    lVar17 = (long)(int)uVar3;
    lVar28 = (long)(int)num_inputs;
    if ((uVar3 & 7) == 0 && (num_inputs & 3) == 0) {
      for (uVar19 = 0; (long)uVar19 < lVar17; uVar19 = uVar19 + 8) {
        uVar13 = *(undefined8 *)(pfVar4 + uVar19 + 4);
        uVar14 = *(undefined8 *)(pfVar4 + uVar19 + 4 + 2);
        local_478[0] = (float)uVar13;
        local_478[1] = (float)((ulong)uVar13 >> 0x20);
        local_478[2] = (float)uVar14;
        local_478[3] = (float)((ulong)uVar14 >> 0x20);
        local_488 = *(float (*) [2])(pfVar4 + uVar19);
        afStack_480 = *(float (*) [2])(pfVar4 + uVar19 + 2);
        pfVar23 = local_500;
        pfVar25 = pfVar29;
        for (lVar30 = 0; lVar30 < lVar28; lVar30 = lVar30 + 4) {
          av1_nn_propagate_4to8_sse3
                    (pfVar23,pfVar25,(__m128 *)local_478,(__m128 *)local_488,num_inputs);
          pfVar25 = pfVar25 + 4;
          pfVar23 = pfVar23 + 4;
        }
        auVar41._4_4_ = local_478[1];
        auVar41._0_4_ = local_478[0];
        auVar41._8_4_ = local_478[2];
        auVar41._12_4_ = local_478[3];
        auVar31._8_4_ = afStack_480[0];
        auVar31._12_4_ = afStack_480[1];
        auVar31._0_4_ = local_488[0];
        auVar31._4_4_ = local_488[1];
        if (uVar27 != uVar18) {
          auVar41 = maxps(auVar41,ZEXT816(0));
          auVar31 = maxps(auVar31,ZEXT816(0));
        }
        *(undefined1 (*) [16])(pfVar15 + (uVar19 | 4)) = auVar41;
        *(undefined1 (*) [16])(pfVar15 + uVar19) = auVar31;
        pfVar29 = pfVar29 + lVar28 * 8;
      }
    }
    else if ((uVar3 & 3) == 0 && (num_inputs & 7) == 0) {
      pfVar29 = pfVar29 + 4;
      for (lVar30 = 0; lVar30 < lVar17; lVar30 = lVar30 + 4) {
        pfVar23 = pfVar29;
        auVar33 = *(undefined1 (*) [16])(pfVar4 + lVar30);
        for (lVar24 = 0; lVar24 < lVar28; lVar24 = lVar24 + 8) {
          pfVar25 = local_500 + lVar24;
          fVar40 = *pfVar25;
          fVar42 = pfVar25[1];
          fVar43 = pfVar25[2];
          fVar44 = pfVar25[3];
          pfVar25 = local_500 + lVar24 + 4;
          fVar45 = *pfVar25;
          fVar46 = pfVar25[1];
          fVar5 = pfVar25[2];
          fVar6 = pfVar25[3];
          pfVar25 = pfVar23;
          for (lVar26 = 0; lVar26 != 0x40; lVar26 = lVar26 + 0x10) {
            fVar7 = pfVar25[-3];
            fVar8 = pfVar25[-2];
            fVar9 = pfVar25[-1];
            fVar10 = pfVar25[1];
            fVar11 = pfVar25[2];
            fVar12 = pfVar25[3];
            *(float *)((long)local_478 + lVar26) = *pfVar25 * fVar45 + pfVar25[-4] * fVar40;
            *(float *)((long)local_478 + lVar26 + 4) = fVar10 * fVar46 + fVar7 * fVar42;
            *(float *)((long)local_478 + lVar26 + 8) = fVar11 * fVar5 + fVar8 * fVar43;
            *(float *)((long)local_478 + lVar26 + 0xc) = fVar12 * fVar6 + fVar9 * fVar44;
            pfVar25 = pfVar25 + lVar28;
          }
          auVar32._0_4_ = auVar33._0_4_ + local_478[0] + local_478[1] + local_478[2] + local_478[3];
          auVar32._4_4_ = auVar33._4_4_ + local_478[4] + local_478[5] + local_478[6] + fStack_45c;
          auVar32._8_4_ = auVar33._8_4_ + local_458 + fStack_454 + fStack_450 + fStack_44c;
          auVar32._12_4_ = auVar33._12_4_ + local_448 + fStack_444 + fStack_440 + fStack_43c;
          pfVar23 = pfVar23 + 8;
          auVar33 = auVar32;
        }
        if (uVar27 != uVar18) {
          auVar33 = maxps(auVar33,_DAT_004241a0);
        }
        *(undefined1 (*) [16])(pfVar15 + lVar30) = auVar33;
        pfVar29 = pfVar29 + lVar28 * 4;
      }
    }
    else if (((num_inputs | uVar3) & 3) == 0) {
      for (lVar30 = 0; lVar30 < lVar17; lVar30 = lVar30 + 4) {
        uVar13 = *(undefined8 *)(pfVar4 + lVar30);
        uVar14 = *(undefined8 *)(pfVar4 + lVar30 + 2);
        local_478[0] = (float)uVar13;
        local_478[1] = (float)((ulong)uVar13 >> 0x20);
        local_478[2] = (float)uVar14;
        local_478[3] = (float)((ulong)uVar14 >> 0x20);
        pfVar23 = local_500;
        pfVar25 = pfVar29;
        for (lVar24 = 0; lVar24 < lVar28; lVar24 = lVar24 + 4) {
          av1_nn_propagate_4to4_sse3(pfVar23,pfVar25,(__m128 *)local_478,num_inputs);
          pfVar25 = pfVar25 + 4;
          pfVar23 = pfVar23 + 4;
        }
        auVar34._4_4_ = local_478[1];
        auVar34._0_4_ = local_478[0];
        auVar34._8_4_ = local_478[2];
        auVar34._12_4_ = local_478[3];
        if (uVar27 != uVar18) {
          auVar34 = maxps(auVar34,_DAT_004241a0);
        }
        *(undefined1 (*) [16])(pfVar15 + lVar30) = auVar34;
        pfVar29 = pfVar29 + lVar28 * 4;
      }
    }
    else if ((num_inputs & 7) == 0) {
      uVar19 = 0;
      if (0 < (int)uVar3) {
        uVar19 = (ulong)uVar3;
      }
      pfVar29 = pfVar29 + 4;
      for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
        fVar40 = pfVar4[uVar20];
        auVar33._4_4_ = fVar40;
        auVar33._0_4_ = fVar40;
        auVar33._8_4_ = fVar40;
        auVar33._12_4_ = fVar40;
        for (lVar17 = 0; lVar17 < lVar28; lVar17 = lVar17 + 8) {
          pfVar2 = local_500 + lVar17;
          pfVar25 = local_500 + lVar17 + 4;
          pfVar1 = pfVar29 + lVar17 + -4;
          pfVar23 = pfVar29 + lVar17;
          fVar40 = *pfVar23 * *pfVar25 + *pfVar1 * *pfVar2;
          fVar43 = pfVar23[1] * pfVar25[1] + pfVar1[1] * pfVar2[1];
          fVar45 = pfVar23[2] * pfVar25[2] + pfVar1[2] * pfVar2[2];
          fVar46 = pfVar23[3] * pfVar25[3] + pfVar1[3] * pfVar2[3];
          fVar42 = fVar40 + fVar43;
          fVar44 = fVar45 + fVar46;
          fVar40 = fVar40 + fVar43;
          fVar45 = fVar45 + fVar46;
          auVar37._0_4_ = auVar33._0_4_ + fVar42 + fVar44;
          auVar37._4_4_ = auVar33._4_4_ + fVar40 + fVar45;
          auVar37._8_4_ = auVar33._8_4_ + fVar42 + fVar44;
          auVar37._12_4_ = auVar33._12_4_ + fVar40 + fVar45;
          auVar33 = auVar37;
        }
        if (uVar27 != uVar18) {
          auVar33 = maxps(auVar33,_DAT_004241a0);
        }
        pfVar15[uVar20] = auVar33._0_4_;
        pfVar29 = pfVar29 + lVar28;
      }
    }
    else if ((num_inputs & 3) == 0) {
      uVar19 = 0;
      if (0 < (int)uVar3) {
        uVar19 = (ulong)uVar3;
      }
      for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
        fVar40 = pfVar4[uVar20];
        auVar39._4_4_ = fVar40;
        auVar39._0_4_ = fVar40;
        auVar39._8_4_ = fVar40;
        auVar39._12_4_ = fVar40;
        for (lVar17 = 0; lVar17 < lVar28; lVar17 = lVar17 + 4) {
          auVar33 = *(undefined1 (*) [16])(local_500 + lVar17);
          pfVar23 = pfVar29 + lVar17;
          fVar40 = *pfVar23 * auVar33._0_4_;
          fVar43 = pfVar23[1] * auVar33._4_4_;
          fVar45 = pfVar23[2] * auVar33._8_4_;
          fVar46 = pfVar23[3] * auVar33._12_4_;
          fVar42 = fVar40 + fVar43;
          fVar44 = fVar45 + fVar46;
          fVar40 = fVar40 + fVar43;
          fVar45 = fVar45 + fVar46;
          auVar38._0_4_ = auVar39._0_4_ + fVar42 + fVar44;
          auVar38._4_4_ = auVar39._4_4_ + fVar40 + fVar45;
          auVar38._8_4_ = auVar39._8_4_ + fVar42 + fVar44;
          auVar38._12_4_ = auVar39._12_4_ + fVar40 + fVar45;
          auVar39 = auVar38;
        }
        if (uVar27 != uVar18) {
          auVar39 = maxps(auVar39,_DAT_004241a0);
        }
        pfVar15[uVar20] = auVar39._0_4_;
        pfVar29 = pfVar29 + lVar28;
      }
    }
    else {
      if ((int)num_inputs < 1) {
        num_inputs = 0;
      }
      uVar19 = 0;
      if (0 < (int)uVar3) {
        uVar19 = (ulong)uVar3;
      }
      for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
        fVar40 = pfVar4[uVar20];
        auVar36._4_4_ = fVar40;
        auVar36._0_4_ = fVar40;
        auVar36._8_4_ = fVar40;
        auVar36._12_4_ = fVar40;
        for (uVar22 = 0; num_inputs != uVar22; uVar22 = uVar22 + 1) {
          fVar40 = local_500[uVar22] * pfVar29[uVar22];
          auVar35._0_4_ = auVar36._0_4_ + fVar40;
          auVar35._4_4_ = auVar36._4_4_ + fVar40;
          auVar35._8_4_ = auVar36._8_4_ + fVar40;
          auVar35._12_4_ = auVar36._12_4_ + fVar40;
          auVar36 = auVar35;
        }
        if (uVar27 != uVar18) {
          auVar36 = maxps(auVar36,_DAT_004241a0);
        }
        pfVar15[uVar20] = auVar36._0_4_;
        pfVar29 = pfVar29 + lVar28;
      }
    }
    uVar21 = 1 - uVar21;
    uVar27 = uVar27 + 1;
    num_inputs = uVar3;
    local_500 = pfVar15;
  }
  if (reduce_prec != 0) {
    av1_nn_output_prec_reduce(output,nn_config->num_outputs);
    return;
  }
  return;
}

Assistant:

void av1_nn_predict_sse3(const float *input_nodes,
                         const NN_CONFIG *const nn_config, int reduce_prec,
                         float *const output) {
  float buf[2][NN_MAX_NODES_PER_LAYER];
  int buf_index = 0;
  int num_inputs = nn_config->num_inputs;

  // Hidden layers, except the final iteration is the output layer.
  for (int layer = 0; layer <= nn_config->num_hidden_layers; layer++) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    bool output_layer = (layer == nn_config->num_hidden_layers);
    float *const output_nodes = output_layer ? output : &buf[buf_index][0];
    const int num_outputs = output_layer ? nn_config->num_outputs
                                         : nn_config->num_hidden_nodes[layer];

    if (num_inputs % 4 == 0 && num_outputs % 8 == 0) {
      for (int out = 0; out < num_outputs; out += 8) {
        __m128 out_h = _mm_loadu_ps(&layer_bias[out + 4]);
        __m128 out_l = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to8_sse3(&input_nodes[in],
                                     &layer_weights[out * num_inputs + in],
                                     &out_h, &out_l, num_inputs);
        }
        if (!output_layer) nn_activate8(&out_h, &out_l);
        _mm_storeu_ps(&output_nodes[out + 4], out_h);
        _mm_storeu_ps(&output_nodes[out], out_l);
      }
    } else if (num_inputs % 8 == 0 && num_outputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out += 4) {
        __m128 outputs = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 8) {
          nn_propagate_8to4(&input_nodes[in],
                            &layer_weights[out * num_inputs + in], &outputs,
                            num_inputs);
        }
        if (!output_layer) nn_activate4(&outputs);
        _mm_storeu_ps(&output_nodes[out], outputs);
      }
    } else if (num_inputs % 4 == 0 && num_outputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out += 4) {
        __m128 outputs = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to4_sse3(&input_nodes[in],
                                     &layer_weights[out * num_inputs + in],
                                     &outputs, num_inputs);
        }
        if (!output_layer) nn_activate4(&outputs);
        _mm_storeu_ps(&output_nodes[out], outputs);
      }
    } else if (num_inputs % 8 == 0) {
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 8) {
          nn_propagate_8to1(&input_nodes[in],
                            &layer_weights[out * num_inputs + in], &total);
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    } else if (num_inputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to1_sse3(
              &input_nodes[in], &layer_weights[out * num_inputs + in], &total);
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    } else {
      // Use SSE instructions for scalar operations to avoid the latency of
      // swapping between SIMD and FPU modes.
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in_node = 0; in_node < num_inputs; in_node++) {
          __m128 input = _mm_load1_ps(&input_nodes[in_node]);
          __m128 weight =
              _mm_load1_ps(&layer_weights[num_inputs * out + in_node]);
          total = _mm_add_ps(total, _mm_mul_ps(input, weight));
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    }
    input_nodes = output_nodes;
    num_inputs = num_outputs;
    buf_index = 1 - buf_index;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}